

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

Vec_Int_t * Frc_ManCollectCos(Frc_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int local_24;
  Frc_Obj_t *pFStack_20;
  int i;
  Frc_Obj_t *pObj;
  Vec_Int_t *vCoOrder;
  Frc_Man_t *p_local;
  
  iVar1 = Frc_ManCoNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar2 = false;
    if (local_24 < iVar1) {
      iVar1 = Vec_IntEntry(p->vCos,local_24);
      pFStack_20 = Frc_ManObj(p,iVar1);
      bVar2 = pFStack_20 != (Frc_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Vec_IntPush(p_00,pFStack_20->hHandle);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Frc_ManCollectCos( Frc_Man_t * p )
{
    Vec_Int_t * vCoOrder;
    Frc_Obj_t * pObj;
    int i;
    vCoOrder = Vec_IntAlloc( Frc_ManCoNum(p) );
    Frc_ManForEachCo( p, pObj, i )
        Vec_IntPush( vCoOrder, pObj->hHandle );
    return vCoOrder;
}